

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.cpp
# Opt level: O3

TValue * luaH_setstr(lua_State *L,Table *t,TString *key)

{
  Node *pNVar1;
  TValue *pTVar2;
  TValue k;
  Value local_10;
  undefined4 local_8;
  
  pNVar1 = t->node + (~(-1 << (t->lsizenode & 0x1f)) & (key->tsv).hash);
  while (((pNVar1->i_key).nk.tt != 4 || ((pNVar1->i_key).nk.value.gc != (GCObject *)key))) {
    pNVar1 = *(Node **)((long)&pNVar1->i_key + 0x10);
    if (pNVar1 == (Node *)0x0) {
LAB_00115282:
      local_8 = 4;
      local_10 = (Value)key;
      pTVar2 = newkey(L,t,(TValue *)&local_10);
      return pTVar2;
    }
  }
  if (pNVar1 != (Node *)&luaO_nilobject_) {
    return &pNVar1->i_val;
  }
  goto LAB_00115282;
}

Assistant:

TValue *luaH_setstr (lua_State *L, Table *t, TString *key) {
  const TValue *p = luaH_getstr(t, key);
  if (p != luaO_nilobject)
    return cast(TValue *, p);
  else {
    TValue k;
    setsvalue(L, &k, key);
    return newkey(L, t, &k);
  }
}